

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  int *piVar1;
  sqlite3_module *psVar2;
  Fts5Expr *pFVar3;
  long *plVar4;
  Fts5Colset *pFVar5;
  uint uVar6;
  int iVar7;
  void *__s;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  Fts5Sorter *pSorter;
  Fts5Sorter *pFVar15;
  int n;
  u8 **local_60;
  int *local_58;
  char *z;
  Fts5Expr *local_48;
  void *local_40;
  long local_38;
  
  pFVar15 = pCsr->pSorter;
  psVar2 = (pCsr->base).pVtab[1].pModule;
  iVar14 = 0;
  if ((pCsr->csrflags & 0x40) != 0) {
    if (*(int *)((long)&psVar2->xColumn + 4) == 0) {
      iVar14 = 0;
    }
    else {
      pFVar3 = pCsr->pExpr;
      local_60 = pa;
      local_58 = pn;
      __s = sqlite3_malloc64((long)pFVar3->nPhrase << 4);
      if (__s == (void *)0x0) {
        uVar9 = 7;
      }
      else {
        uVar9 = 0;
        memset(__s,0,(long)pFVar3->nPhrase << 4);
        uVar10 = (ulong)(uint)pFVar3->nPhrase;
        if (pFVar3->nPhrase < 1) {
          uVar10 = uVar9;
        }
        for (lVar8 = 0; uVar10 * 8 != lVar8; lVar8 = lVar8 + 8) {
          plVar4 = *(long **)((long)pFVar3->apExprPhrase + lVar8);
          if ((pFVar15 == (Fts5Sorter *)0x0) &&
             ((((int)plVar4[2] == 0 || (*(long *)(*plVar4 + 0x18) != pFVar3->pRoot->iRowid)) ||
              (*(int *)(*plVar4 + 4) != 0)))) {
            *(undefined4 *)((long)__s + lVar8 * 2 + 0xc) = 1;
          }
          else {
            *(undefined4 *)(plVar4 + 2) = 0;
          }
        }
      }
      uVar10 = 0;
      while ((iVar14 = (int)uVar9, (long)uVar10 < (long)*(int *)&psVar2->xBestIndex && (iVar14 == 0)
             )) {
        uVar6 = fts5ApiColumnText((Fts5Context *)pCsr,(int)uVar10,&z,&n);
        uVar9 = (ulong)uVar6;
        if (uVar6 == 0) {
          local_48 = pCsr->pExpr;
          local_38 = (uVar10 << 0x20) + -1;
          uVar9 = (ulong)(uint)local_48->nPhrase;
          if (local_48->nPhrase < 1) {
            uVar9 = 0;
          }
          for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
            pFVar5 = local_48->apExprPhrase[uVar11]->pNode->pNear->pColset;
            if (pFVar5 != (Fts5Colset *)0x0) {
              uVar12 = (ulong)(uint)pFVar5->nCol;
              if (pFVar5->nCol < 1) {
                uVar12 = 0;
              }
              uVar13 = 0;
              do {
                if (uVar12 == uVar13) goto LAB_001a8a01;
                piVar1 = pFVar5->aiCol + uVar13;
                uVar13 = uVar13 + 1;
              } while (uVar10 != (uint)*piVar1);
            }
            if (*(int *)((long)__s + uVar11 * 0x10 + 0xc) == 0) {
              *(undefined4 *)((long)__s + uVar11 * 0x10 + 8) = 1;
            }
            else {
LAB_001a8a01:
              *(undefined4 *)((long)__s + uVar11 * 0x10 + 8) = 0;
            }
          }
          local_40 = __s;
          if (z == (char *)0x0) {
            uVar9 = 0;
          }
          else {
            uVar6 = (**(code **)(psVar2->xBegin + 0x10))
                              (psVar2->xUpdate,&local_48,4,z,n,fts5ExprPopulatePoslistsCb);
            uVar9 = (ulong)uVar6;
          }
        }
        uVar10 = uVar10 + 1;
      }
      sqlite3_free(__s);
      if (pCsr->pSorter == (Fts5Sorter *)0x0) {
        pFVar15 = (Fts5Sorter *)0x0;
        pa = local_60;
        pn = local_58;
      }
      else {
        fts5ExprCheckPoslists(pCsr->pExpr->pRoot,pCsr->pSorter->iRowid);
        pFVar15 = pCsr->pSorter;
        pa = local_60;
        pn = local_58;
      }
    }
    *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xbf;
  }
  if ((pFVar15 == (Fts5Sorter *)0x0) || (*(int *)((long)&psVar2->xColumn + 4) != 0)) {
    iVar7 = sqlite3Fts5ExprPoslist(pCsr->pExpr,iPhrase,pa);
    *pn = iVar7;
  }
  else {
    if (iPhrase == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = pFVar15->aIdx[(long)iPhrase + -1];
    }
    *pn = pFVar15->aIdx[iPhrase] - iVar7;
    *pa = pFVar15->aPoslist + iVar7;
  }
  return iVar14;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr, 
  int iPhrase, 
  const u8 **pa,
  int *pn
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){

    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;
      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        int n; const char *z;
        rc = fts5ApiColumnText((Fts5Context*)pCsr, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
    *pn = pSorter->aIdx[iPhrase] - i1;
    *pa = &pSorter->aPoslist[i1];
  }else{
    *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
  }

  return rc;
}